

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

time_t curl_getdate(char *p,time_t *now)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  int *piVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  byte *pbVar16;
  char *pcVar17;
  uint uVar18;
  char **what;
  char **ppcVar19;
  bool bVar20;
  bool bVar21;
  char *pcStack_90;
  uint local_88;
  uint local_80;
  int local_7c;
  int len;
  int minnum;
  int hournum;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  char *end;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  byte *local_38;
  
  hournum = -1;
  minnum = -1;
  local_7c = -1;
  local_88 = 0xffffffff;
  bVar21 = false;
  local_68 = 0xffffffff;
  uVar18 = 0;
  uVar15 = 0xffffffff;
  lVar13 = 0xffffffff;
  local_80 = local_88;
  local_38 = (byte *)p;
  do {
    bVar12 = *p;
    uVar5 = (uint)uVar15;
    if ((bVar12 == 0) || (5 < uVar18)) {
      if (local_7c == -1) {
        hournum = 0;
        minnum = 0;
        local_7c = 0;
      }
      iVar6 = (int)local_68;
      if (((local_80 != 0xffffffff) && (uVar5 != 0xffffffff)) && (iVar6 != -1)) {
        if (iVar6 < 0x7b2) {
          return 0;
        }
        if (((local_7c < 0x3d) && ((int)local_80 < 0x20)) &&
           (((int)uVar5 < 0xc && ((hournum < 0x18 && (minnum < 0x3c)))))) {
          if ((int)uVar5 < 0) {
            iVar6 = (0xb - uVar5) / 0xc + iVar6;
            uVar15 = (ulong)(0xb - (0xb - uVar5) % 0xc);
          }
          uVar18 = iVar6 - (uint)((int)uVar5 < 2);
          lVar13 = (((long)hournum +
                    ((long)(int)local_80 + (ulong)(iVar6 - 0x7b2) * 0x16d +
                     (long)*(int *)(my_timegm_month_days_cumulative + uVar15 * 4) +
                    (long)(int)(uVar18 / 400 + ((uVar18 >> 2) - uVar18 / 100) + -0x1dd)) * 0x18) *
                    0x3c + (long)minnum) * 0x3c;
          if (local_88 == 0xffffffff) {
            local_88 = 0;
          }
          lVar9 = 0;
          if ((int)lVar13 + local_7c != 0x1517f) {
            lVar9 = (long)(int)local_88;
          }
          return lVar9 + lVar13 + local_7c + -0x15180;
        }
      }
      return -1;
    }
    ppuVar7 = __ctype_b_loc();
    pcVar17 = (char *)0x0;
    while (bVar12 != 0) {
      uVar1 = (*ppuVar7)[bVar12];
      if ((uVar1 & 8) != 0) goto LAB_004cfbad;
      pcVar4 = pcVar17 + 1;
      pcVar17 = pcVar17 + 1;
      bVar12 = ((byte *)p)[(long)pcVar4];
    }
    uVar1 = **ppuVar7;
LAB_004cfbad:
    pbVar16 = (byte *)p + (long)pcVar17;
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 0xb & 1) != 0) {
        len = 0;
        local_6c = uVar18;
        if (local_7c == -1) {
          iVar6 = __isoc99_sscanf(pbVar16,"%02d:%02d:%02d%n",&hournum,&minnum,&local_7c,&len);
          if (iVar6 == 3) {
            pbVar16 = (byte *)p + (long)(pcVar17 + len);
            uVar18 = local_6c;
          }
          else {
            if ((local_7c != -1) ||
               (iVar6 = __isoc99_sscanf(pbVar16,"%02d:%02d%n",&hournum,&minnum,&len), iVar6 != 2))
            goto LAB_004cfbdd;
            pbVar16 = (byte *)p + (long)(pcVar17 + len);
            local_7c = 0;
            uVar18 = local_6c;
          }
        }
        else {
LAB_004cfbdd:
          local_5c = uVar5;
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          *piVar8 = 0;
          lVar9 = strtol((char *)pbVar16,&end,10);
          uVar18 = local_5c;
          iVar2 = *piVar8;
          if (iVar2 != iVar6) {
            *piVar8 = iVar6;
          }
          uVar15 = (ulong)local_5c;
          if (iVar2 != 0) {
            return -1;
          }
          if (lVar9 - 0x80000000U < 0xffffffff00000000) {
            return -1;
          }
          uVar5 = curlx_sltosi(lVar9);
          uVar11 = (ulong)uVar5;
          pcStack_90 = end + (-(long)pcVar17 - (long)p);
          if (local_88 == 0xffffffff) {
            bVar3 = false;
            if (pbVar16 <= local_38) {
              local_88 = 0xffffffff;
              goto LAB_004cfc5e;
            }
            if (end + (-4 - (long)p) == pcVar17) {
              local_88 = 0xffffffff;
              if ((int)uVar5 < 0x579) {
                bVar12 = ((byte *)p)[(long)(pcVar17 + -1)];
                if ((bVar12 != 0x2d) && (bVar12 != 0x2b)) {
                  pcStack_90 = (char *)0x4;
                  goto LAB_004cffa4;
                }
                iVar6 = ((int)uVar5 / 100) * 0x3c + (int)uVar5 % 100;
                local_88 = iVar6 * -0x3c;
                if (bVar12 != 0x2b) {
                  local_88 = iVar6 * 0x3c;
                }
                bVar3 = true;
                pcStack_90 = (char *)0x4;
              }
            }
            else {
LAB_004cffa4:
              bVar3 = false;
              local_88 = 0xffffffff;
            }
          }
          else {
LAB_004cfc5e:
            bVar3 = false;
          }
          if ((((pcStack_90 == (char *)0x8) && ((int)local_68 == -1)) && (uVar18 == 0xffffffff)) &&
             (local_80 == 0xffffffff)) {
            local_68 = (long)(int)uVar5 / 10000 & 0xffffffff;
            uVar15 = (ulong)(uint)(int)(short)((short)((long)(int)uVar5 % 10000) / 100 + -1);
            local_80 = (int)uVar5 % 100;
            bVar3 = true;
          }
          bVar14 = (bool)(local_80 == 0xffffffff & !bVar21 & ~bVar3);
          bVar20 = uVar5 - 1 < 0x1f;
          uVar18 = 0xffffffff;
          if (bVar20) {
            uVar18 = uVar5;
          }
          bVar20 = (bool)(bVar20 & bVar14);
          if (bVar14) {
            bVar21 = true;
            local_80 = uVar18;
          }
          pbVar16 = (byte *)end;
          uVar18 = local_6c;
          if (((bVar20 || bVar3) || (!bVar21)) || ((int)local_68 != -1)) {
            if (!bVar20 && !bVar3) {
              return -1;
            }
          }
          else {
            if ((int)uVar5 < 0x76c) {
              if ((int)uVar5 < 0x47) {
                uVar11 = (ulong)(uVar5 + 2000);
              }
              else {
                uVar11 = (ulong)(uVar5 + 0x76c);
              }
            }
            bVar21 = local_80 != 0xffffffff;
            local_68 = uVar11;
          }
        }
      }
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      end = (char *)0x0;
      uStack_50 = 0;
      iVar6 = __isoc99_sscanf(pbVar16,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &end);
      if (iVar6 == 0) {
        sVar10 = 0;
        local_6c = uVar18;
      }
      else {
        local_6c = uVar18;
        sVar10 = strlen((char *)&end);
      }
      if ((int)lVar13 == -1) {
        ppcVar19 = Curl_wkday;
        if (3 < sVar10) {
          ppcVar19 = weekday;
        }
        for (lVar13 = 0; (int)lVar13 != 7; lVar13 = lVar13 + 1) {
          iVar6 = Curl_strcasecompare((char *)&end,ppcVar19[lVar13]);
          if (iVar6 != 0) goto LAB_004cff05;
        }
        lVar13 = 0xffffffff;
      }
      if (uVar5 == 0xffffffff) {
        ppcVar19 = Curl_month;
        for (uVar5 = 0; uVar5 != 0xc; uVar5 = uVar5 + 1) {
          iVar6 = Curl_strcasecompare((char *)&end,*ppcVar19);
          if (iVar6 != 0) goto LAB_004cff05;
          ppcVar19 = ppcVar19 + 1;
        }
        uVar5 = 0xffffffff;
      }
      if (local_88 != 0xffffffff) {
        return -1;
      }
      lVar9 = 0;
      while( true ) {
        if ((int)lVar9 == 0x330) {
          return -1;
        }
        iVar6 = Curl_strcasecompare((char *)&end,tz[0].name + lVar9);
        if (iVar6 != 0) break;
        lVar9 = lVar9 + 0xc;
      }
      local_88 = *(int *)(tz[0].name + lVar9 + 8) * 0x3c;
LAB_004cff05:
      uVar15 = (ulong)uVar5;
      pbVar16 = (byte *)p + (long)(pcVar17 + sVar10);
      uVar18 = local_6c;
    }
    uVar18 = uVar18 + 1;
    p = (char *)pbVar16;
  } while( true );
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  switch(rc) {
  case PARSEDATE_OK:
  case PARSEDATE_LATER:
  case PARSEDATE_SOONER:
    return parsed;
  }
  /* everything else is fail */
  return -1;
}